

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O3

void soplex::
     updateRes<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *facset,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *resvecprev,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *resvec,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *tmpvec,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eprev,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *qcurr,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char cVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint local_148 [3];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [13];
  undefined3 uStack_9b;
  undefined5 uStack_98;
  undefined8 local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  auVar2 = *(undefined1 (*) [16])(eprev->m_backend).data._M_elems;
  local_168 = *(undefined1 (*) [16])((eprev->m_backend).data._M_elems + 4);
  local_158 = *(undefined1 (*) [16])((eprev->m_backend).data._M_elems + 8);
  local_148._0_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 0xc);
  uVar1 = *(undefined8 *)((eprev->m_backend).data._M_elems + 0xe);
  stack0xfffffffffffffec0 = (undefined5)uVar1;
  uStack_13b = (undefined3)((ulong)uVar1 >> 0x28);
  iVar3 = (eprev->m_backend).exp;
  cVar4 = (eprev->m_backend).neg;
  fVar5 = (eprev->m_backend).fpclass;
  iVar6 = (eprev->m_backend).prec_elem;
  local_130._0_4_ = (eprev->m_backend).fpclass;
  local_130._4_4_ = (eprev->m_backend).prec_elem;
  local_128.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
  local_128.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
  local_128.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
  local_128.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
  local_128.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
  local_128.data._M_elems._40_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 10);
  local_128.data._M_elems._48_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 0xc);
  local_128.data._M_elems._56_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 0xe);
  local_128.exp = (epsilon->m_backend).exp;
  local_128.neg = (epsilon->m_backend).neg;
  local_128.fpclass = (epsilon->m_backend).fpclass;
  local_128.prec_elem = (epsilon->m_backend).prec_elem;
  bStack_134 = (bool)cVar4;
  if (((bool)cVar4 == true) &&
     (local_178._0_4_ = (undefined4)*(undefined8 *)(eprev->m_backend).data._M_elems,
     local_178._0_4_ != 0 || fVar5 != cpp_dec_float_finite)) {
    bStack_134 = false;
  }
  local_178 = auVar2;
  iStack_138 = iVar3;
  if (local_128.fpclass == cpp_dec_float_NaN || fVar5 == cpp_dec_float_NaN) {
LAB_001421cc:
    local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eprev->m_backend).data._M_elems;
    local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 2);
    local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 4);
    local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 6);
    local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 8);
    local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 10)
    ;
    local_88.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((eprev->m_backend).data._M_elems + 0xc);
    local_88.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((eprev->m_backend).data._M_elems + 0xe);
    local_88.m_backend.exp = iVar3;
    local_88.m_backend.neg = (bool)cVar4;
    local_88.m_backend.fpclass = fVar5;
    local_88.m_backend.prec_elem = iVar6;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)resvec,&local_88);
  }
  else {
    iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      ((cpp_dec_float<100U,_int,_void> *)local_178,&local_128);
    if (0 < iVar3) {
      iVar3 = (eprev->m_backend).exp;
      cVar4 = (eprev->m_backend).neg;
      fVar5 = (eprev->m_backend).fpclass;
      iVar6 = (eprev->m_backend).prec_elem;
      goto LAB_001421cc;
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(resvec);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(tmpvec);
  iVar3 = (resvecprev->super_IdxSet).num;
  if (iVar3 == 1) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)tmpvec,facset,resvecprev);
  }
  else {
    if ((tmpvec->setupStatus != true) ||
       ((double)(facset->set).thenum *
        (double)((int)((ulong)((long)(tmpvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(tmpvec->
                                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333)
        * 0.5 < (double)(facset->
                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ).thesize * (double)iVar3)) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      assign2productFull<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)tmpvec,facset,resvecprev);
      tmpvec->setupStatus = false;
      goto LAB_0014229c;
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2productShort<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)tmpvec,facset,resvecprev);
  }
  tmpvec->setupStatus = true;
LAB_0014229c:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(tmpvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)resvec,tmpvec);
  local_90._0_4_ = cpp_dec_float_finite;
  local_90._4_4_ = 0x10;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_9b = 0;
  uStack_98._0_4_ = 0;
  uStack_98._4_1_ = false;
  local_130._0_4_ = cpp_dec_float_finite;
  local_130._4_4_ = 0x10;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_148[0] = 0;
  local_148[1] = 0;
  stack0xfffffffffffffec0 = 0;
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)local_178,-1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((cpp_dec_float<100U,_int,_void> *)local_d8,(cpp_dec_float<100U,_int,_void> *)local_178,
             &qcurr->m_backend);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)resvec,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_d8);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(resvec);
  return;
}

Assistant:

static inline void updateRes(
   const SVSetBase<R> facset,
   const SSVectorBase<R> resvecprev,
   SSVectorBase<R>& resvec,
   SSVectorBase<R>& tmpvec,
   R eprev,
   R qcurr,
   R epsilon)
{
   assert(qcurr != 0.0);

   if(isZero(eprev, epsilon))
      resvec.clear();
   else
      resvec *= eprev;

   int dummy1 = 0;
   int dummy2 = 0;
   tmpvec.assign2product4setup(facset, resvecprev, nullptr, nullptr, dummy1, dummy2);
   tmpvec.setup();
   resvec += tmpvec;

   resvec *= (-1.0 / qcurr);
   resvec.setup();
}